

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandIProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int *pModel;
  uint uVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  char *pcVar5;
  Abc_Cex_t *local_d0;
  Abc_Cex_t *pCex;
  int *pSimInfo;
  Abc_Obj_t *pAStack_b8;
  int i;
  Abc_Obj_t *pObj;
  abctime clk;
  int local_a0;
  int iOut;
  int RetValue;
  int c;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  Prove_Params_t *pParams;
  Prove_Params_t Params;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)&pParams;
  clk._4_4_ = 0xffffffff;
  Params.nTotalInspectsMade = (ABC_INT64_T)argv;
  pNtkTemp = Abc_FrameReadNtk(pAbc);
  Prove_ParamsSetDefault((Prove_Params_t *)pNtk);
  pNtk->ntkFunc = ABC_FUNC_SOP;
  *(undefined4 *)((long)&pNtk->pName + 4) = 0;
  Extra_UtilGetoptReset();
LAB_0024f50e:
  iOut = Extra_UtilGetopt(argc,(char **)Params.nTotalInspectsMade,"NCFGLIrfbvh");
  if (iOut == -1) {
    if (pNtkTemp == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar2 = Abc_NtkLatchNum(pNtkTemp);
    if (0 < iVar2) {
      Abc_Print(-1,"The network has registers. Use \"dprove\".\n");
      return 1;
    }
    pObj = (Abc_Obj_t *)Abc_Clock();
    iVar2 = Abc_NtkIsStrash(pNtkTemp);
    if (iVar2 == 0) {
      _RetValue = Abc_NtkStrash(pNtkTemp,0,0,0);
    }
    else {
      _RetValue = Abc_NtkDup(pNtkTemp);
    }
    local_a0 = Abc_NtkIvyProve((Abc_Ntk_t **)&RetValue,pNtk);
    if (local_a0 != 0) goto LAB_0024fa2b;
    pCex = (Abc_Cex_t *)Abc_NtkVerifySimulatePattern(pNtkTemp,_RetValue->pModel);
    pSimInfo._4_4_ = 0;
    goto LAB_0024f93e;
  }
  switch(iOut) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      goto LAB_0024fb36;
    }
    iVar2 = atoi(*(char **)(Params.nTotalInspectsMade + (long)globalUtilOptind * 8));
    *(int *)((long)&pNtk->pSpec + 4) = iVar2;
    iVar2 = *(int *)((long)&pNtk->pSpec + 4);
    break;
  default:
    goto LAB_0024fb36;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_0024fb36;
    }
    iVar2 = atoi(*(char **)(Params.nTotalInspectsMade + (long)globalUtilOptind * 8));
    *(int *)((long)&pNtk->vObjs + 4) = iVar2;
    iVar2 = *(int *)((long)&pNtk->vObjs + 4);
    break;
  case 0x47:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
      goto LAB_0024fb36;
    }
    iVar2 = atoi(*(char **)(Params.nTotalInspectsMade + (long)globalUtilOptind * 8));
    *(float *)&pNtk->vPis = (float)iVar2;
    globalUtilOptind = globalUtilOptind + 1;
    if (*(float *)&pNtk->vPis <= 0.0 && *(float *)&pNtk->vPis != 0.0) goto LAB_0024fb36;
    goto LAB_0024f50e;
  case 0x49:
    if (globalUtilOptind < argc) goto LAB_0024f7ba;
    Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
    goto LAB_0024fb36;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_0024fb36;
    }
    iVar2 = atoi(*(char **)(Params.nTotalInspectsMade + (long)globalUtilOptind * 8));
    *(int *)((long)&pNtk->vPos + 4) = iVar2;
    iVar2 = *(int *)((long)&pNtk->vPos + 4);
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_0024fb36;
    }
    iVar2 = atoi(*(char **)(Params.nTotalInspectsMade + (long)globalUtilOptind * 8));
    *(int *)&pNtk->pSpec = iVar2;
    iVar2 = *(int *)&pNtk->pSpec;
    break;
  case 0x62:
    *(uint *)&pNtk->pName = *(uint *)&pNtk->pName ^ 1;
    goto LAB_0024f50e;
  case 0x66:
    pNtk->ntkType = pNtk->ntkType ^ ABC_NTK_NETLIST;
    goto LAB_0024f50e;
  case 0x68:
    goto LAB_0024fb36;
  case 0x72:
    pNtk->ntkFunc = pNtk->ntkFunc ^ ABC_FUNC_SOP;
    goto LAB_0024f50e;
  case 0x76:
    *(uint *)((long)&pNtk->pName + 4) = *(uint *)((long)&pNtk->pName + 4) ^ 1;
    goto LAB_0024f50e;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (iVar2 < 0) goto LAB_0024fb36;
  goto LAB_0024f50e;
LAB_0024f93e:
  uVar3 = pSimInfo._4_4_;
  iVar2 = Abc_NtkCoNum(pNtkTemp);
  uVar1 = pSimInfo._4_4_;
  if (iVar2 <= (int)uVar3) {
LAB_0024f9cf:
    pSimInfo._4_4_ = uVar1;
    uVar3 = Abc_NtkCoNum(pNtkTemp);
    if (uVar1 == uVar3) {
      Abc_Print(1,"ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
    }
    if (pCex != (Abc_Cex_t *)0x0) {
      free(pCex);
      pCex = (Abc_Cex_t *)0x0;
    }
LAB_0024fa2b:
    pAbc->Status = local_a0;
    if (local_a0 == -1) {
      Abc_Print(1,"UNDECIDED      ");
    }
    else if (local_a0 == 0) {
      Abc_Print(1,"SATISFIABLE (output = %d) ",(ulong)clk._4_4_);
    }
    else {
      Abc_Print(1,"UNSATISFIABLE  ");
    }
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar4 - (long)pObj);
    Abc_FrameReplaceCurrentNetwork(pAbc,_RetValue);
    if ((local_a0 == 0) && (iVar2 = Abc_NtkLatchNum(_RetValue), iVar2 == 0)) {
      pModel = _RetValue->pModel;
      iVar2 = Abc_NtkPiNum(_RetValue);
      local_d0 = Abc_CexDeriveFromCombModel(pModel,iVar2,0,clk._4_4_);
      Abc_FrameReplaceCex(pAbc,&local_d0);
    }
    return 0;
  }
  pAStack_b8 = Abc_NtkCo(pNtkTemp,pSimInfo._4_4_);
  if ((&pCex->iPo)[(int)pSimInfo._4_4_] == 1) {
    clk._4_4_ = pSimInfo._4_4_;
    uVar1 = pSimInfo._4_4_;
    goto LAB_0024f9cf;
  }
  pSimInfo._4_4_ = pSimInfo._4_4_ + 1;
  goto LAB_0024f93e;
LAB_0024f7ba:
  iVar2 = atoi(*(char **)(Params.nTotalInspectsMade + (long)globalUtilOptind * 8));
  pNtk->vCos = (Vec_Ptr_t *)(long)iVar2;
  globalUtilOptind = globalUtilOptind + 1;
  if ((long)pNtk->vCos < 0) {
LAB_0024fb36:
    Abc_Print(-2,"usage: iprove [-NCFGLI num] [-rfbvh]\n");
    Abc_Print(-2,"\t         performs CEC using a new method\n");
    Abc_Print(-2,"\t-N num : max number of iterations [default = %d]\n",(ulong)*(uint *)&pNtk->pSpec
             );
    Abc_Print(-2,"\t-C num : max starting number of conflicts in mitering [default = %d]\n",
              (ulong)*(uint *)((long)&pNtk->pSpec + 4));
    Abc_Print(-2,"\t-F num : max starting number of conflicts in fraiging [default = %d]\n",
              (ulong)*(uint *)((long)&pNtk->vObjs + 4));
    Abc_Print(-2,"\t-G num : multiplicative coefficient for fraiging [default = %d]\n",
              (ulong)(uint)(int)*(float *)&pNtk->vPis);
    Abc_Print(-2,"\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n",
              (ulong)*(uint *)((long)&pNtk->vPos + 4));
    Abc_Print(-2,"\t-I num : max number of clause inspections in all SAT calls [default = %d]\n",
              (ulong)pNtk->vCos & 0xffffffff);
    pcVar5 = "no";
    if (pNtk->ntkFunc != ABC_FUNC_NONE) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (pNtk->ntkType != ABC_NTK_NONE) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-f     : toggle the use of FRAIGing [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (*(int *)&pNtk->pName != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-b     : toggle the use of BDDs [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (*(int *)((long)&pNtk->pName + 4) != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar5);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    return 1;
  }
  goto LAB_0024f50e;
}

Assistant:

int Abc_CommandIProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pNtk, * pNtkTemp;
    int c, RetValue, iOut = -1;
    abctime clk;

    extern int Abc_NtkIvyProve( Abc_Ntk_t ** ppNtk, void * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Prove_ParamsSetDefault( pParams );
    pParams->fUseRewriting = 1;
    pParams->fVerbose      = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFGLIrfbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nItersMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitMulti = (float)atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitMulti < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitLast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitLast < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nTotalInspectLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nTotalInspectLimit < 0 )
                goto usage;
            break;
        case 'r':
            pParams->fUseRewriting ^= 1;
            break;
        case 'f':
            pParams->fUseFraiging ^= 1;
            break;
        case 'b':
            pParams->fUseBdds ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "The network has registers. Use \"dprove\".\n" );
        return 1;
    }

    clk = Abc_Clock();

    if ( Abc_NtkIsStrash(pNtk) )
        pNtkTemp = Abc_NtkDup( pNtk );
    else
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );

    RetValue = Abc_NtkIvyProve( &pNtkTemp, pParams );

    // verify that the pattern is correct
    if ( RetValue == 0 )
    {
        Abc_Obj_t * pObj;
        int i;
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtkTemp->pModel );
        Abc_NtkForEachCo( pNtk, pObj, i )
            if ( pSimInfo[i] == 1 )
            {
                iOut = i;
                break;
            }
        if ( i == Abc_NtkCoNum(pNtk) )
            Abc_Print( 1, "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        ABC_FREE( pSimInfo );
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE (output = %d) ", iOut );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkTemp );
    // update counter example
    if ( RetValue == 0 && Abc_NtkLatchNum(pNtkTemp) == 0 )
    {
        Abc_Cex_t * pCex = Abc_CexDeriveFromCombModel( pNtkTemp->pModel, Abc_NtkPiNum(pNtkTemp), 0, iOut );
        Abc_FrameReplaceCex( pAbc, &pCex );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: iprove [-NCFGLI num] [-rfbvh]\n" );
    Abc_Print( -2, "\t         performs CEC using a new method\n" );
    Abc_Print( -2, "\t-N num : max number of iterations [default = %d]\n", pParams->nItersMax );
    Abc_Print( -2, "\t-C num : max starting number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitStart );
    Abc_Print( -2, "\t-F num : max starting number of conflicts in fraiging [default = %d]\n", pParams->nFraigingLimitStart );
    Abc_Print( -2, "\t-G num : multiplicative coefficient for fraiging [default = %d]\n", (int)pParams->nFraigingLimitMulti );
    Abc_Print( -2, "\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitLast );
    Abc_Print( -2, "\t-I num : max number of clause inspections in all SAT calls [default = %d]\n", (int)pParams->nTotalInspectLimit );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", pParams->fUseRewriting? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle the use of FRAIGing [default = %s]\n", pParams->fUseFraiging? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle the use of BDDs [default = %s]\n", pParams->fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}